

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *s,QUuid *id)

{
  int i;
  long lVar1;
  qint64 qVar2;
  Endian in_EDX;
  undefined1 *extraout_RDX;
  long in_FS_OFFSET;
  Id128Bytes *local_28;
  undefined1 *apuStack_20 [2];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (Id128Bytes *)&DAT_aaaaaaaaaaaaaaaa;
  apuStack_20[0] = &DAT_aaaaaaaaaaaaaaaa;
  if (s->noswap == false) {
    local_28 = QUuid::toBytes((Id128Bytes *)id,(QUuid *)0x0,in_EDX);
    apuStack_20[0] = extraout_RDX;
  }
  else {
    local_28 = *(Id128Bytes **)id;
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      *(uchar *)((long)apuStack_20 + lVar1) = id->data4[lVar1];
    }
  }
  qVar2 = QDataStream::writeRawData(s,(char *)&local_28,0x10);
  if (qVar2 != 0x10) {
    QDataStream::setStatus(s,WriteFailed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QUuid &id)
{
    constexpr int NumBytes = sizeof(QUuid);
    static_assert(NumBytes == 16, "Change the serialization format when this ever hits");
    char bytes[NumBytes];
    if (s.byteOrder() == QDataStream::BigEndian) {
        const auto id128 = id.toBytes();
        static_assert(sizeof(id128) == NumBytes);
        memcpy(bytes, &id128, NumBytes);
    } else {
        auto *data = bytes;

        // for historical reasons, our little-endian serialization format
        // stores each of the UUID fields in little endian, instead of storing
        // a little endian Id128
        qToLittleEndian(id.data1, data);
        data += sizeof(quint32);
        qToLittleEndian(id.data2, data);
        data += sizeof(quint16);
        qToLittleEndian(id.data3, data);
        data += sizeof(quint16);

        for (int i = 0; i < 8; ++i) {
            *(data) = id.data4[i];
            data++;
        }
    }

    if (s.writeRawData(bytes, NumBytes) != NumBytes)
        s.setStatus(QDataStream::WriteFailed);

    return s;
}